

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

IT_PLAYING * new_playing(DUMB_IT_SIGRENDERER *itsr)

{
  IT_PLAYING *__ptr;
  void *_r;
  void *pvVar1;
  
  __ptr = itsr->free_playing;
  if (__ptr == (IT_PLAYING *)0x0) {
    __ptr = (IT_PLAYING *)malloc(0x128);
    if (__ptr != (IT_PLAYING *)0x0) {
      (__ptr->resampler).fir_resampler_ratio = 0.0;
      _r = resampler_create();
      (__ptr->resampler).fir_resampler[0] = _r;
      if (_r != (void *)0x0) {
        pvVar1 = resampler_create();
        (__ptr->resampler).fir_resampler[1] = pvVar1;
        if (pvVar1 != (void *)0x0) {
          return __ptr;
        }
        resampler_delete(_r);
      }
      free(__ptr);
      __ptr = (IT_PLAYING *)0x0;
    }
  }
  else {
    itsr->free_playing = __ptr->next;
  }
  return __ptr;
}

Assistant:

static IT_PLAYING *new_playing(DUMB_IT_SIGRENDERER *itsr)
{
	IT_PLAYING *r;

	if (itsr->free_playing != NULL)
	{
		r = itsr->free_playing;
		itsr->free_playing = r->next;
		return r;
	}
	r = (IT_PLAYING *)malloc(sizeof(IT_PLAYING));
	if (r)
	{
		r->resampler.fir_resampler_ratio = 0.0;
		r->resampler.fir_resampler[0] = resampler_create();
		if ( !r->resampler.fir_resampler[0] ) {
			free( r );
			return NULL;
		}
		r->resampler.fir_resampler[1] = resampler_create();
		if ( !r->resampler.fir_resampler[1] ) {
			resampler_delete( r->resampler.fir_resampler[0] );
			free( r );
			return NULL;
		}
	}
	return r;
}